

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetDebugReadMemoryPrologue
          (ZETParameterValidation *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,
          zet_debug_memory_space_desc_t *desc,size_t size,void *buffer)

{
  zet_structure_type_t *pzVar1;
  zet_structure_type_t *pzVar2;
  ze_result_t zVar3;
  bool bVar4;
  initializer_list<_zet_structure_type_t> __l;
  vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_> baseTypes;
  allocator_type local_2d;
  _zet_structure_type_t local_2c;
  vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_> local_28;
  
  if (hDebug == (zet_debug_session_handle_t)0x0) {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((buffer != (void *)0x0 && desc != (zet_debug_memory_space_desc_t *)0x0) &&
       (zVar3 = ZE_RESULT_ERROR_INVALID_ENUMERATION, (int)desc->type < 3)) {
      local_2c = ZET_STRUCTURE_TYPE_DEBUG_MEMORY_SPACE_DESC;
      __l._M_len = 1;
      __l._M_array = &local_2c;
      std::vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>::vector
                (&local_28,__l,&local_2d);
      zVar3 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
      if (local_28.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_28.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = false;
        pzVar1 = local_28.
                 super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          pzVar2 = pzVar1 + 1;
          if (desc->stype == *pzVar1) {
            bVar4 = true;
            break;
          }
          pzVar1 = pzVar2;
        } while (pzVar2 != local_28.
                           super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if ((bVar4) && (((int *)desc->pNext == (int *)0x0 || (*desc->pNext < 0x100000)))) {
          zVar3 = ZE_RESULT_SUCCESS;
        }
      }
      if (local_28.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_start != (zet_structure_type_t *)0x0) {
        operator_delete(local_28.
                        super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetDebugReadMemoryPrologue(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier.
        const zet_debug_memory_space_desc_t* desc,      ///< [in] memory space descriptor
        size_t size,                                    ///< [in] the number of bytes to read
        void* buffer                                    ///< [in,out] a buffer to hold a copy of the memory
        )
    {
        if( nullptr == hDebug )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == buffer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZET_DEBUG_MEMORY_SPACE_TYPE_ELF < desc->type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }